

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorSpeed.cpp
# Opt level: O3

void __thiscall chrono::ChShaftsMotorSpeed::ChShaftsMotorSpeed(ChShaftsMotorSpeed *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChFunction *__tmp;
  undefined1 auVar2 [32];
  undefined1 auVar3 [64];
  
  ChObj::ChObj((ChObj *)this);
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   ((long)&(this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data + 4) = auVar2;
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.system =
       (ChSystem *)auVar2._0_8_;
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.vis_model_instance =
       (shared_ptr<chrono::ChVisualModelInstance>)auVar2._8_16_;
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar2._24_8_;
  *(undefined1 (*) [32])&(this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft1 =
       ZEXT1632(ZEXT816(0) << 0x40);
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsMotorSpeed_00b239d0;
  ChVariablesGeneric::ChVariablesGeneric(&this->variable,1);
  this->motor_torque = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.c_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.l_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.cfm_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint).super_ChConstraintTwo.variables_a = (ChVariables *)SUB168(ZEXT416(0) << 0x40,0)
  ;
  (this->constraint).super_ChConstraintTwo.variables_b = (ChVariables *)SUB168(ZEXT416(0) << 0x40,8)
  ;
  auVar3 = ZEXT464(0) << 0x40;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_00b3ae50;
  (this->constraint).Cq_a = (ChRowVectorDynamic<double>)auVar3._0_16_;
  (this->constraint).Cq_b = (ChRowVectorDynamic<double>)auVar3._16_16_;
  (this->constraint).Eq_a = (ChVectorDynamic<double>)auVar3._32_16_;
  (this->constraint).Eq_b = (ChVectorDynamic<double>)auVar3._48_16_;
  if ((((0 < (this->variable).Mmass.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
             .m_storage.m_rows) &&
       (0 < (this->variable).Mmass.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
            m_storage.m_cols)) &&
      (*(this->variable).Mmass.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
        m_storage.m_data = 1.0,
      0 < (this->variable).inv_Mmass.
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows)) &&
     (0 < (this->variable).inv_Mmass.
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols)) {
    *(this->variable).inv_Mmass.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
     m_storage.m_data = 1.0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
    p_Var1->_M_use_count = 1;
    p_Var1->_M_weak_count = 1;
    p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
    p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
    p_Var1[1]._M_use_count = 0;
    p_Var1[1]._M_weak_count = 0x3ff00000;
    (this->f_speed).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var1 + 1);
    this_00 = (this->f_speed).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->f_speed).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var1;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    this->rot_offset = 0.0;
    this->aux_dt = 0.0;
    this->aux_dtdt = 0.0;
    this->avoid_angle_drift = true;
    return;
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

ChShaftsMotorSpeed::ChShaftsMotorSpeed() : motor_torque(0) {

    this->variable.GetMass()(0,0) = 1.0;
    this->variable.GetInvMass()(0,0) = 1.0;

    this->f_speed = chrono_types::make_shared<ChFunction_Const>(1.0);

    this->rot_offset = 0;

    this->aux_dt = 0; // used for integrating speed, = pos
    this->aux_dtdt = 0;

    this->avoid_angle_drift = true;
}